

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType::clear_SizeFlexibility(ImageFeatureType *this)

{
  SizeFlexibilityCase SVar1;
  ImageFeatureType *this_local;
  
  SVar1 = SizeFlexibility_case(this);
  if (SVar1 != SIZEFLEXIBILITY_NOT_SET) {
    if (SVar1 == kEnumeratedSizes) {
      if ((this->SizeFlexibility_).enumeratedsizes_ != (ImageFeatureType_EnumeratedImageSizes *)0x0)
      {
        (*(((this->SizeFlexibility_).enumeratedsizes_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((SVar1 == kImageSizeRange) &&
            ((this->SizeFlexibility_).enumeratedsizes_ !=
             (ImageFeatureType_EnumeratedImageSizes *)0x0)) {
      (*(((this->SizeFlexibility_).enumeratedsizes_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void ImageFeatureType::clear_SizeFlexibility() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.ImageFeatureType)
  switch (SizeFlexibility_case()) {
    case kEnumeratedSizes: {
      delete SizeFlexibility_.enumeratedsizes_;
      break;
    }
    case kImageSizeRange: {
      delete SizeFlexibility_.imagesizerange_;
      break;
    }
    case SIZEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = SIZEFLEXIBILITY_NOT_SET;
}